

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O0

int duckdb_hll::sdsll2str(char *s,longlong value)

{
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  char *pcVar4;
  unsigned_long_long local_38;
  size_t l;
  unsigned_long_long v;
  char aux;
  char *p;
  longlong value_local;
  char *s_local;
  
  local_38 = value;
  if (value < 0) {
    local_38 = -value;
  }
  v = local_38;
  pcVar4 = s;
  do {
    p = pcVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = v;
    pcVar4 = p + 1;
    *p = SUB161(auVar2 % ZEXT816(10),0) + '0';
    v = v / 10;
  } while (v != 0);
  if (value < 0) {
    *pcVar4 = '-';
    pcVar4 = p + 2;
  }
  p = pcVar4;
  iVar3 = (int)p;
  *p = '\0';
  for (s_local = s; p = p + -1, s_local < p; s_local = s_local + 1) {
    cVar1 = *s_local;
    *s_local = *p;
    *p = cVar1;
  }
  return iVar3 - (int)s;
}

Assistant:

int sdsll2str(char *s, long long value) {
    char *p, aux;
    unsigned long long v;
    size_t l;

    /* Generate the string representation, this method produces
     * an reversed string. */
    v = (value < 0) ? -value : value;
    p = s;
    do {
        *p++ = '0'+(v%10);
        v /= 10;
    } while(v);
    if (value < 0) *p++ = '-';

    /* Compute length and add null term. */
    l = p-s;
    *p = '\0';

    /* Reverse the string. */
    p--;
    while(s < p) {
        aux = *s;
        *s = *p;
        *p = aux;
        s++;
        p--;
    }
    return l;
}